

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_3_4::Header::erase(Header *this,char *name)

{
  bool bVar1;
  ArgExc *this_00;
  pointer ppVar2;
  char *in_RSI;
  iterator i;
  stringstream _iex_throw_s;
  map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
  *in_stack_fffffffffffffd18;
  Name *in_stack_fffffffffffffd20;
  map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
  *this_01;
  iterator in_stack_fffffffffffffd28;
  _Self local_2b8 [33];
  _Self local_1b0 [3];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  if (*in_RSI != '\0') {
    Name::Name(in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
    local_1b0[0]._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
         ::find(in_stack_fffffffffffffd18,(key_type *)0x1d758a);
    local_2b8[0]._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
         ::end(in_stack_fffffffffffffd18);
    bVar1 = std::operator!=(local_1b0,local_2b8);
    if (bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>
                           *)0x1d75c6);
      this_01 = (map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
                 *)ppVar2->second;
      if (this_01 !=
          (map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
           *)0x0) {
        (*(*(_func_int ***)&(this_01->_M_t)._M_impl)[1])();
      }
      std::
      map<Imf_3_4::Name,Imf_3_4::Attribute*,std::less<Imf_3_4::Name>,std::allocator<std::pair<Imf_3_4::Name_const,Imf_3_4::Attribute*>>>
      ::erase_abi_cxx11_(this_01,in_stack_fffffffffffffd28);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,"Image attribute name cannot be an empty string.");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
Header::erase (const char name[])
{
    if (name[0] == 0)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Image attribute name cannot be an empty string.");

    AttributeMap::iterator i = _map.find (name);
    if (i != _map.end ())
    {
        delete i->second;
        _map.erase (i);
    }
}